

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O3

Status sentencepiece::SentencePieceTrainer::SetProtoField
                 (string_view name,string_view value,TrainerSpec *message)

{
  uint32 *puVar1;
  _Rb_tree_color _Var2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  uint uVar6;
  string_util *this;
  uint *result;
  uint *__s1;
  void *pvVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *__n;
  TrainerSpec *pTVar10;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> this_00;
  string_util *psVar11;
  TrainerSpec *in_R9;
  size_type __rlen;
  string *val;
  undefined1 auVar12 [8];
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  string_view arg_11;
  string_view arg_12;
  string_view arg_13;
  string_view arg_14;
  string_view arg_15;
  string_view arg_16;
  string_view arg_17;
  string_view arg_18;
  string_view arg_19;
  string_view arg_20;
  string_view arg_21;
  string_view arg_22;
  string_view arg_23;
  string_view arg_24;
  string_view arg_25;
  string_view arg_26;
  string_view arg_27;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
  __l;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  int32 v;
  string upper_value;
  int32 local_1d0;
  undefined4 uStack_1cc;
  allocator_type local_1c1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  *local_1c0;
  undefined1 local_1b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_140 [6];
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> local_38;
  
  __n = name._M_str;
  this_00._M_head_impl = (Rep *)name._M_len;
  this = (string_util *)value._M_str;
  __s1 = (uint *)value._M_len;
  if (in_R9 == (TrainerSpec *)0x0) {
    local_1b8._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"third_party/sentencepiece/src/spec_parser.h",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"(",1);
    std::ostream::operator<<((ostringstream *)&local_1b0,0xc5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"message",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
    goto LAB_00209745;
  }
  if (__n == (char *)0xc) {
    if (__s1[2] == 0x74616d72 && *(long *)__s1 == 0x6f665f7475706e69) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      *(byte *)(in_R9->_has_bits_).has_bits_ = (byte)(in_R9->_has_bits_).has_bits_[0] | 2;
      pvVar7 = (in_R9->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar7 & 1) != 0) {
        pvVar7 = *(void **)((ulong)pvVar7 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set(&in_R9->input_format_,local_1b8,pvVar7);
    }
    else {
      if (__s1[2] != 0x78696665 || *(long *)__s1 != 0x72705f6c65646f6d) goto LAB_00208cfe;
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      *(byte *)(in_R9->_has_bits_).has_bits_ = (byte)(in_R9->_has_bits_).has_bits_[0] | 1;
      pvVar7 = (in_R9->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar7 & 1) != 0) {
        pvVar7 = *(void **)((ulong)pvVar7 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set(&in_R9->model_prefix_,local_1b8,pvVar7);
    }
    goto LAB_00208e4e;
  }
  if ((__n == (char *)0x5) && ((char)__s1[1] == 't' && *__s1 == 0x75706e69)) {
    text._M_str = (char *)0x0;
    text._M_len = (size_t)message;
    util::StrSplitAsCSV_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8,(util *)this,text);
    for (auVar12 = local_1b8; auVar12 != (undefined1  [8])local_1b0;
        auVar12 = (undefined1  [8])((long)auVar12 + 0x20)) {
      TrainerSpec::add_input(in_R9,(string *)auVar12);
    }
LAB_00209982:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
LAB_0020998c:
    util::Status::Status((Status *)this_00._M_head_impl);
    return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )this_00._M_head_impl;
  }
LAB_00208cfe:
  if ((SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
       ::kModelType_Map_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                                   ::kModelType_Map_abi_cxx11_), iVar4 != 0)) {
    local_38._M_head_impl = this_00._M_head_impl;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                *)local_1b8,(char (*) [8])0x34312b,&TrainerSpec::UNIGRAM);
    local_1c0 = &local_190;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[4],_true>(local_1c0,(char (*) [4])0x343502,&TrainerSpec::BPE);
    local_1c0 = &local_168;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[5],_true>(local_1c0,(char (*) [5])"WORD",&TrainerSpec::WORD);
    local_1c0 = local_140;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[5],_true>(local_1c0,(char (*) [5])"CHAR",&TrainerSpec::CHAR);
    __l._M_len = 4;
    __l._M_array = (iterator)local_1b8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
    ::map(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
           ::kModelType_Map_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_1d0,&local_1c1);
    local_1c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                 *)0xffffffffffffff60;
    paVar9 = &local_140[0].first.field_2;
    do {
      if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar9->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                        paVar9->_M_allocated_capacity + 1);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar9->_M_allocated_capacity + -5);
      local_1c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                   *)((long)local_1c0 + 0x28);
    } while (local_1c0 !=
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
              *)0x0);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                 ::~map,&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                         ::kModelType_Map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                         ::kModelType_Map_abi_cxx11_);
    this_00._M_head_impl = local_38._M_head_impl;
  }
  result = &switchD_00208d28::switchdataD_00254c44;
  switch(__n) {
  case (char *)0x6:
    iVar4 = bcmp(__s1,"unk_id",(size_t)__n);
    if (iVar4 == 0) {
      arg_17._M_str = (char *)&local_1d0;
      arg_17._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_17,(int *)result);
      if (!bVar3) {
        local_1b8._0_4_ = 3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"cannot parse \"",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,(char *)message,(long)this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
        goto LAB_00209745;
      }
      (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x200000;
      in_R9->unk_id_ = local_1d0;
      goto LAB_0020998c;
    }
    uVar6 = (ushort)__s1[1] ^ 0x6469 | *__s1 ^ 0x5f736f62;
    if (uVar6 == 0) {
      arg_25._M_str = (char *)&local_1d0;
      arg_25._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_25,(int *)(ulong)uVar6);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x80;
        in_R9->bos_id_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    uVar6 = (ushort)__s1[1] ^ 0x6469 | *__s1 ^ 0x5f736f65;
    if (uVar6 == 0) {
      arg_27._M_str = (char *)&local_1d0;
      arg_27._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_27,(int *)(ulong)uVar6);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x100;
        in_R9->eos_id_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    uVar6 = (ushort)__s1[1] ^ 0x6469 | *__s1 ^ 0x5f646170;
    if (uVar6 == 0) {
      arg._M_str = (char *)&local_1d0;
      arg._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg,(int *)(ulong)uVar6);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x200;
        in_R9->pad_id_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x9:
    iVar4 = bcmp(__s1,"unk_piece",(size_t)__n);
    if (iVar4 == 0) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_unk_piece(in_R9,(string *)local_1b8);
    }
    else if ((char)__s1[2] == 'e' && *(long *)__s1 == 0x636569705f736f62) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_bos_piece(in_R9,(string *)local_1b8);
    }
    else if ((char)__s1[2] == 'e' && *(long *)__s1 == 0x636569705f736f65) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_eos_piece(in_R9,(string *)local_1b8);
    }
    else {
      if ((char)__s1[2] != 'e' || *(long *)__s1 != 0x636569705f646170) break;
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_pad_piece(in_R9,(string *)local_1b8);
    }
LAB_00208e4e:
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
    }
    goto LAB_0020998c;
  case (char *)0xa:
    if ((short)__s1[2] == 0x6570 && *(long *)__s1 == 0x79745f6c65646f6d) {
      local_1b8 = (undefined1  [8])&local_1a8;
      local_38._M_head_impl = this_00._M_head_impl;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)(&message->_has_bits_ + -5));
      auVar12 = local_1b8;
      if (local_1b0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        lVar8 = 0;
        do {
          iVar4 = toupper((int)*(char *)((long)auVar12 + lVar8));
          *(char *)((long)auVar12 + lVar8) = (char)iVar4;
          lVar8 = lVar8 + 1;
        } while (local_1b0 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)lVar8);
      }
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
              ::find(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                      ::kModelType_Map_abi_cxx11_._M_t,(key_type *)local_1b8);
      this_00._M_head_impl = local_38._M_head_impl;
      if (local_1b8 != (undefined1  [8])&local_1a8) {
        operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      if ((_Rb_tree_header *)cVar5._M_node !=
          &SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
           ::kModelType_Map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        _Var2 = cVar5._M_node[2]._M_color;
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x1000000;
        in_R9->model_type_ = _Var2;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"unknown enumeration value of \"",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as ",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"kModelType_Map",0xe)
      ;
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    if ((short)__s1[2] == 0x657a && *(long *)__s1 == 0x69735f6261636f76) {
      arg_04._M_str = (char *)&local_1d0;
      arg_04._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_04,(int *)0x0);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x2000000;
        in_R9->vocab_size_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0xb:
    iVar4 = bcmp(__s1,"num_threads",(size_t)__n);
    if (iVar4 == 0) {
      arg_18._M_str = (char *)&local_1d0;
      arg_18._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_18,(int *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x20000000;
        in_R9->num_threads_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"unk_surface",(size_t)__n);
    if (iVar4 == 0) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_unk_surface(in_R9,(string *)local_1b8);
      goto LAB_00208e4e;
    }
    break;
  case (char *)0xc:
    iVar4 = bcmp(__s1,"split_digits",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_05._M_str = (char *)&local_1d0;
      arg_05._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_05,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x20000;
        in_R9->split_digits_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0xd:
    iVar4 = bcmp(__s1,"byte_fallback",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_16._M_str = (char *)&local_1d0;
      arg_16._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_16,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x40000;
        in_R9->byte_fallback_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"use_all_vocab",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_09._M_str = (char *)&local_1d0;
      arg_09._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_09,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x80000;
        in_R9->use_all_vocab_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0xe:
    iVar4 = bcmp(__s1,"required_chars",(size_t)__n);
    if (iVar4 == 0) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_required_chars(in_R9,(string *)local_1b8);
      goto LAB_00208e4e;
    }
    break;
  case (char *)0xf:
    iVar4 = bcmp(__s1,"accept_language",(size_t)__n);
    if (iVar4 == 0) {
      text_02._M_str = (char *)result;
      text_02._M_len = (size_t)message;
      util::StrSplitAsCSV_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8,(util *)this,text_02);
      for (auVar12 = local_1b8; auVar12 != (undefined1  [8])local_1b0;
          auVar12 = (undefined1  [8])((long)auVar12 + 0x20)) {
        TrainerSpec::add_accept_language(in_R9,(string *)auVar12);
      }
    }
    else {
      iVar4 = bcmp(__s1,"split_by_number",(size_t)__n);
      if (iVar4 == 0) {
        psVar11 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar11 = this;
        }
        pTVar10 = (TrainerSpec *)0x343c44;
        if (this != (string_util *)0x0) {
          pTVar10 = message;
        }
        arg_26._M_str = (char *)&local_1d0;
        arg_26._M_len = (size_t)pTVar10;
        bVar3 = string_util::lexical_cast<bool>(psVar11,arg_26,(bool *)result);
        if (bVar3) {
          puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
          *puVar1 = *puVar1 | 8;
          in_R9->split_by_number_ = (bool)local_1d0._0_1_;
          goto LAB_0020998c;
        }
        local_1b8._0_4_ = 3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"cannot parse \"",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,(char *)message,(long)this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
        goto LAB_00209745;
      }
      iVar4 = bcmp(__s1,"control_symbols",(size_t)__n);
      if (iVar4 != 0) break;
      text_01._M_str = (char *)result;
      text_01._M_len = (size_t)message;
      util::StrSplitAsCSV_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8,(util *)this,text_01);
      for (auVar12 = local_1b8; auVar12 != (undefined1  [8])local_1b0;
          auVar12 = (undefined1  [8])((long)auVar12 + 0x20)) {
        TrainerSpec::add_control_symbols(in_R9,(string *)auVar12);
      }
    }
    goto LAB_00209982;
  case (char *)0x10:
    iVar4 = bcmp(__s1,"shrinking_factor",(size_t)__n);
    if (iVar4 == 0) {
      arg_22._M_str = (char *)&local_1d0;
      arg_22._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<double>(this,arg_22,(double *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x10000000;
        in_R9->shrinking_factor_ = (float)(double)CONCAT44(uStack_1cc,local_1d0);
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"hard_vocab_limit",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_12._M_str = (char *)&local_1d0;
      arg_12._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_12,(bool *)result);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x40;
        in_R9->hard_vocab_limit_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x12:
    iVar4 = bcmp(__s1,"character_coverage",(size_t)__n);
    if (iVar4 == 0) {
      arg_21._M_str = (char *)&local_1d0;
      arg_21._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<double>(this,arg_21,(double *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x4000000;
        in_R9->character_coverage_ = (float)(double)CONCAT44(uStack_1cc,local_1d0);
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"num_sub_iterations",(size_t)__n);
    if (iVar4 == 0) {
      arg_11._M_str = (char *)&local_1d0;
      arg_11._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_11,(int *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x40000000;
        in_R9->num_sub_iterations_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x13:
    iVar4 = bcmp(__s1,"input_sentence_size",(size_t)__n);
    if (iVar4 == 0) {
      arg_14._M_str = (char *)&local_1d0;
      arg_14._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<unsigned_long>(this,arg_14,(unsigned_long *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x1000;
        in_R9->input_sentence_size_ = CONCAT44(uStack_1cc,local_1d0);
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"max_sentence_length",(size_t)__n);
    if (iVar4 == 0) {
      arg_24._M_str = (char *)&local_1d0;
      arg_24._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_24,(int *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x80000000;
        in_R9->max_sentence_length_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"split_by_whitespace",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_03._M_str = (char *)&local_1d0;
      arg_03._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_03,(bool *)result);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x10;
        in_R9->split_by_whitespace_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x14:
    iVar4 = bcmp(__s1,"user_defined_symbols",(size_t)__n);
    if (iVar4 == 0) {
      text_00._M_str = (char *)result;
      text_00._M_len = (size_t)message;
      util::StrSplitAsCSV_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8,(util *)this,text_00);
      for (auVar12 = local_1b8; auVar12 != (undefined1  [8])local_1b0;
          auVar12 = (undefined1  [8])((long)auVar12 + 0x20)) {
        TrainerSpec::add_user_defined_symbols(in_R9,(string *)auVar12);
      }
      goto LAB_00209982;
    }
    break;
  case (char *)0x15:
    iVar4 = bcmp(__s1,"self_test_sample_size",(size_t)__n);
    if (iVar4 == 0) {
      arg_07._M_str = (char *)&local_1d0;
      arg_07._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_07,(int *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x400;
        in_R9->self_test_sample_size_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x16:
    iVar4 = bcmp(__s1,"shuffle_input_sentence",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_02._M_str = (char *)&local_1d0;
      arg_02._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_02,(bool *)result);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 2;
        in_R9->shuffle_input_sentence_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x17:
    iVar4 = bcmp(__s1,"seed_sentencepiece_size",(size_t)__n);
    if (iVar4 == 0) {
      arg_19._M_str = (char *)&local_1d0;
      arg_19._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_19,(int *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x8000000;
        in_R9->seed_sentencepiece_size_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"split_by_unicode_script",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_10._M_str = (char *)&local_1d0;
      arg_10._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_10,(bool *)result);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 4;
        in_R9->split_by_unicode_script_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x18:
    iVar4 = bcmp(__s1,"max_sentencepiece_length",(size_t)__n);
    if (iVar4 == 0) {
      arg_20._M_str = (char *)&local_1d0;
      arg_20._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<int>(this,arg_20,(int *)result);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 1;
        in_R9->max_sentencepiece_length_ = local_1d0;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"seed_sentencepieces_file",(size_t)__n);
    if (iVar4 == 0) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_seed_sentencepieces_file(in_R9,(string *)local_1b8);
      goto LAB_00208e4e;
    }
    break;
  case (char *)0x19:
    iVar4 = bcmp(__s1,"pretokenization_delimiter",(size_t)__n);
    if (iVar4 == 0) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      TrainerSpec::set_pretokenization_delimiter(in_R9,(string *)local_1b8);
      goto LAB_00208e4e;
    }
    break;
  case (char *)0x1a:
    iVar4 = bcmp(__s1,"treat_whitespace_as_suffix",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_13._M_str = (char *)&local_1d0;
      arg_13._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_13,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x8000;
        in_R9->treat_whitespace_as_suffix_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x1b:
    iVar4 = bcmp(__s1,"enable_differential_privacy",(size_t)__n);
    if (iVar4 == 0) {
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      arg_00._M_str = (char *)&local_1d0;
      arg_00._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_00,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x4000;
        in_R9->enable_differential_privacy_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x1c:
    iVar4 = bcmp(__s1,"allow_whitespace_only_pieces",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_15._M_str = (char *)&local_1d0;
      arg_15._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_15,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x10000;
        in_R9->allow_whitespace_only_pieces_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    iVar4 = bcmp(__s1,"train_extremely_large_corpus",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_08._M_str = (char *)&local_1d0;
      arg_08._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_08,(bool *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x100000;
        in_R9->train_extremely_large_corpus_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x1d:
    iVar4 = bcmp(__s1,"vocabulary_output_piece_score",(size_t)__n);
    if (iVar4 == 0) {
      psVar11 = (string_util *)0x4;
      if (this != (string_util *)0x0) {
        psVar11 = this;
      }
      pTVar10 = (TrainerSpec *)0x343c44;
      if (this != (string_util *)0x0) {
        pTVar10 = message;
      }
      arg_23._M_str = (char *)&local_1d0;
      arg_23._M_len = (size_t)pTVar10;
      bVar3 = string_util::lexical_cast<bool>(psVar11,arg_23,(bool *)result);
      if (bVar3) {
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x20;
        in_R9->vocabulary_output_piece_score_ = (bool)local_1d0._0_1_;
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x20:
    iVar4 = bcmp(__s1,"differential_privacy_noise_level",(size_t)__n);
    if (iVar4 == 0) {
      arg_01._M_str = (char *)&local_1d0;
      arg_01._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<double>(this,arg_01,(double *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x400000;
        in_R9->differential_privacy_noise_level_ = (float)(double)CONCAT44(uStack_1cc,local_1d0);
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
    break;
  case (char *)0x27:
    iVar4 = bcmp(__s1,"differential_privacy_clipping_threshold",(size_t)__n);
    if (iVar4 == 0) {
      arg_06._M_str = (char *)&local_1d0;
      arg_06._M_len = (size_t)message;
      bVar3 = string_util::lexical_cast<unsigned_long>(this,arg_06,(unsigned_long *)result);
      if (bVar3) {
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x800000;
        in_R9->differential_privacy_clipping_threshold_ = CONCAT44(uStack_1cc,local_1d0);
        goto LAB_0020998c;
      }
      local_1b8._0_4_ = 3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"cannot parse \"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,(char *)message,(long)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
      goto LAB_00209745;
    }
  }
  local_1b8._0_4_ = 5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"unknown field name \"",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)__s1,(long)__n);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"\" in TrainerSpec.",0x11);
  util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this_00._M_head_impl);
LAB_00209745:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  std::ios_base::~ios_base((ios_base *)local_140);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this_00._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::SetProtoField(absl::string_view name,
                                                 absl::string_view value,
                                                 TrainerSpec *message) {
  CHECK_OR_RETURN(message);

  PARSE_REPEATED_STRING(input);
  PARSE_STRING(input_format);
  PARSE_STRING(model_prefix);

  static const std::map<std::string, TrainerSpec::ModelType> kModelType_Map = {
      {"UNIGRAM", TrainerSpec::UNIGRAM},
      {"BPE", TrainerSpec::BPE},
      {"WORD", TrainerSpec::WORD},
      {"CHAR", TrainerSpec::CHAR},
  };

  PARSE_ENUM(model_type, kModelType_Map);
  PARSE_INT32(vocab_size);
  PARSE_REPEATED_STRING(accept_language);
  PARSE_INT32(self_test_sample_size);
  PARSE_DOUBLE(character_coverage);
  PARSE_UINT64(input_sentence_size);
  PARSE_BOOL(shuffle_input_sentence);
  PARSE_INT32(seed_sentencepiece_size);
  PARSE_DOUBLE(shrinking_factor);
  PARSE_INT32(max_sentence_length);
  PARSE_INT32(num_threads);
  PARSE_INT32(num_sub_iterations);
  PARSE_INT32(max_sentencepiece_length);
  PARSE_BOOL(split_by_unicode_script);
  PARSE_BOOL(split_by_number);
  PARSE_BOOL(split_by_whitespace);
  PARSE_BOOL(split_digits);
  PARSE_STRING(pretokenization_delimiter);
  PARSE_BOOL(treat_whitespace_as_suffix);
  PARSE_BOOL(allow_whitespace_only_pieces);
  PARSE_REPEATED_STRING(control_symbols);
  PARSE_REPEATED_STRING(user_defined_symbols);
  PARSE_STRING(required_chars);
  PARSE_BOOL(byte_fallback);
  PARSE_BOOL(hard_vocab_limit);
  PARSE_BOOL(vocabulary_output_piece_score);
  PARSE_BOOL(train_extremely_large_corpus);
  PARSE_STRING(seed_sentencepieces_file);
  PARSE_BOOL(use_all_vocab);
  PARSE_INT32(unk_id);
  PARSE_INT32(bos_id);
  PARSE_INT32(eos_id);
  PARSE_INT32(pad_id);
  PARSE_STRING(unk_piece);
  PARSE_STRING(bos_piece);
  PARSE_STRING(eos_piece);
  PARSE_STRING(pad_piece);
  PARSE_STRING(unk_surface);
  PARSE_BOOL(enable_differential_privacy);
  PARSE_DOUBLE(differential_privacy_noise_level);
  PARSE_UINT64(differential_privacy_clipping_threshold);

  return util::StatusBuilder(util::StatusCode::kNotFound, GTL_LOC)
         << "unknown field name \"" << name << "\" in TrainerSpec.";
}